

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

Iterator __thiscall
Map<int,_bool>::insert(Map<int,_bool> *this,Item **cell,Item *parent,int *key,bool *value)

{
  Item *pIVar1;
  usize uVar2;
  code *pcVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  ItemBlock *pIVar7;
  ulong uVar8;
  Item *pIVar9;
  long lVar10;
  Iterator *pIVar11;
  long lVar12;
  Item *unaff_R13;
  Item *pIVar13;
  
  do {
    if ((cell != &parent->right && (cell != &parent->left && parent != (Item *)0x0)) &&
       (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                              ,0x188,"!parent || cell == &parent->left || cell == &parent->right"),
       iVar6 != 0)) {
LAB_00104ff3:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    pIVar13 = *cell;
    if (pIVar13 == (Item *)0x0) {
      pIVar13 = this->freeItem;
      if (pIVar13 == (Item *)0x0) {
        pIVar7 = (ItemBlock *)operator_new__(0x108);
        pIVar7->next = this->blocks;
        this->blocks = pIVar7;
        lVar10 = 8;
        lVar12 = 0;
        uVar5 = 0xffffffffffffffc8;
        do {
          uVar8 = uVar5;
          *(long *)((long)&pIVar7[0xf].next + uVar8) = lVar12;
          lVar12 = (long)&pIVar7->next + lVar10;
          lVar10 = lVar10 + 0x40;
          uVar5 = uVar8 + 0x40;
        } while (uVar8 + 0x40 < 200);
        pIVar13 = (Item *)((long)&pIVar7[8].next + uVar8);
        this->freeItem = pIVar13;
      }
      pIVar13->key = *key;
      pIVar13->value = *value;
      pIVar13->parent = parent;
      pIVar13->left = (Item *)0x0;
      pIVar13->right = (Item *)0x0;
      pIVar13->height = 1;
      pIVar13->slope = 0;
      this->freeItem = pIVar13->prev;
      *cell = pIVar13;
      this->_size = this->_size + 1;
      if (parent == (Item *)0x0) {
        if (((this->_begin).item != &this->endItem) &&
           (iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/../include/nstd/Map.hpp"
                                  ,0x1a1,"_begin.item == &endItem"), iVar6 != 0)) goto LAB_00104ff3;
        pIVar13->prev = (Item *)0x0;
        pIVar13->next = (this->_begin).item;
        (this->_begin).item = pIVar13;
        (this->endItem).prev = pIVar13;
      }
      else {
        pIVar9 = parent;
        if (cell == &parent->right) {
          pIVar9 = parent->next;
        }
        pIVar1 = pIVar9->prev;
        pIVar13->prev = pIVar1;
        pIVar11 = &this->_begin;
        if (pIVar1 != (Item *)0x0) {
          pIVar11 = (Iterator *)&pIVar9->prev->next;
        }
        pIVar11->item = pIVar13;
        pIVar13->next = pIVar9;
        pIVar9->prev = pIVar13;
        do {
          uVar2 = parent->height;
          Item::updateHeightAndSlope(parent);
          parent = rebal(this,parent);
          bVar4 = true;
          if (uVar2 == parent->height) goto LAB_00104fd6;
          parent = parent->parent;
        } while (parent != (Item *)0x0);
      }
      bVar4 = true;
      parent = (Item *)0x0;
    }
    else {
      if (pIVar13->key < *key) {
        cell = &pIVar13->right;
      }
      else {
        if (pIVar13->key <= *key) {
          pIVar13->value = *value;
          bVar4 = true;
          goto LAB_00104fd6;
        }
        cell = &pIVar13->left;
      }
      bVar4 = false;
      parent = pIVar13;
      pIVar13 = unaff_R13;
    }
LAB_00104fd6:
    unaff_R13 = pIVar13;
    if (bVar4) {
      return (Iterator)pIVar13;
    }
  } while( true );
}

Assistant:

Iterator insert(Item** cell, Item* parent, const T& key, const V& value)
  {
  begin:
    ASSERT(!parent || cell == &parent->left || cell == &parent->right);
    Item* position = *cell;
    if(!position)
    {
      Item* item = freeItem;
      if(!item)
      {
        ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
        itemBlock->next = blocks;
        blocks = itemBlock;
        for(Item* i = (Item*)(itemBlock + 1), * end = i + 4; i < end; ++i)
        {
          i->prev = item;
          item = i;
        }
        freeItem = item;
      }

      new(item) Item(parent, key, value);
      freeItem = item->prev;

      *cell = item;
      ++_size;
      if(!parent)
      { // first item
        ASSERT(_begin.item == &endItem);
        item->prev = 0;
        item->next = _begin.item;
        _begin.item = item;
        endItem.prev = item;
      }
      else
      {
        Item* insertPos = cell == &parent->right ? 
          parent->next : // insert after parent
          parent; // insert before parent
        if((item->prev = insertPos->prev))
          insertPos->prev->next = item;
        else
          _begin.item = item;
        item->next = insertPos;
        insertPos->prev = item;

        // neu:
        usize oldHeight;
        do
        {
          oldHeight = parent->height;
          parent->updateHeightAndSlope();
          parent = rebal(parent);
          if(oldHeight == parent->height)
            break;
          parent = parent->parent;
        } while(parent);
      }
      return item;
    }
    else
    {
      if(key > position->key)
      {
        cell = &position->right;
        parent = position;
        goto begin;
      }
      else if(key < position->key)
      {
        cell = &position->left;
        parent = position;
        goto begin;
      }
      else
      {
        position->value = value;
        return position;
      }
    }
  }